

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vanilla_date.cpp
# Opt level: O0

int32_t __thiscall
cornelich::cycle_formatter_yyyymmddhh::cycle_from_date_impl
          (cycle_formatter_yyyymmddhh *this,string *date)

{
  bool bVar1;
  bool bVar2;
  long lVar3;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  end;
  int64_t iVar4;
  long *in_FS_OFFSET;
  int64_t unix_timestamp;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<3600L,_1L>_>_>
  local_58;
  time_point local_50;
  time_point ts;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_38;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_30;
  int local_24;
  string *psStack_20;
  int h;
  string *date_local;
  cycle_formatter_yyyymmddhh *this_local;
  
  local_24 = 0;
  psStack_20 = date;
  date_local = (string *)this;
  lVar3 = std::__cxx11::string::length();
  if (lVar3 == 10) {
    bVar2 = parse_date(psStack_20,(day_point *)(*in_FS_OFFSET + -0x10));
    bVar1 = true;
    if (bVar2) {
      local_38._M_current = (char *)std::__cxx11::string::begin();
      local_30 = __gnu_cxx::
                 __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator+(&local_38,8);
      ts.__d.__r = (duration)std::__cxx11::string::begin();
      end = __gnu_cxx::
            __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator+((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&ts,10);
      bVar2 = util::parse_number<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                        (local_30,end,&local_24);
      bVar1 = true;
      if (bVar2) {
        bVar1 = 0x18 < local_24;
      }
    }
    if (bVar1) {
      this_local._4_4_ = -1;
    }
    else {
      lVar3 = *in_FS_OFFSET;
      std::chrono::duration<long,std::ratio<3600l,1l>>::duration<int,void>
                ((duration<long,std::ratio<3600l,1l>> *)&unix_timestamp,&local_24);
      local_58 = std::chrono::operator+
                           ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L,_1L>_>_>
                             *)(lVar3 + -0x10),
                            (duration<long,_std::ratio<3600L,_1L>_> *)&unix_timestamp);
      std::chrono::
      time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>
      ::time_point<std::chrono::duration<long,std::ratio<3600l,1l>>,void>
                ((time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>
                  *)&local_50,&local_58);
      iVar4 = get_epoch_seconds(&local_50);
      this_local._4_4_ =
           (int32_t)((iVar4 * 1000) / (long)(this->super_cycle_formatter).m_cycle_length);
    }
  }
  else {
    this_local._4_4_ = -1;
  }
  return this_local._4_4_;
}

Assistant:

std::int32_t cycle_formatter_yyyymmddhh::cycle_from_date_impl(const std::string & date) const
{
    thread_local day_point dp;
    int h = 0;
    if(BOOST_UNLIKELY(date.length() != 10))
        return -1;
    if(BOOST_UNLIKELY(
                !parse_date(date, dp) ||
                !util::parse_number(date.begin() + 8, date.begin() + 10, h) || h > 24))
        return -1;
    system_clock::time_point ts = dp + hours(h);
    auto unix_timestamp = get_epoch_seconds(ts);

    return unix_timestamp * 1000 / m_cycle_length;
}